

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_loader.cpp
# Opt level: O0

XrResult xrGetActionStateBoolean
                   (XrSession session,XrActionStateGetInfo *getInfo,XrActionStateBoolean *state)

{
  unique_ptr<XrGeneratedDispatchTableCore,_std::default_delete<XrGeneratedDispatchTableCore>_> *this
  ;
  pointer pXVar1;
  exception *e;
  XrResult local_34;
  LoaderInstance *pLStack_30;
  XrResult result;
  LoaderInstance *loader_instance;
  XrActionStateBoolean *state_local;
  XrActionStateGetInfo *getInfo_local;
  XrSession session_local;
  
  loader_instance = (LoaderInstance *)state;
  state_local = (XrActionStateBoolean *)getInfo;
  getInfo_local = (XrActionStateGetInfo *)session;
  local_34 = ActiveLoaderInstance::Get(&stack0xffffffffffffffd0,"xrGetActionStateBoolean");
  if (XR_ERROR_VALIDATION_FAILURE < local_34) {
    this = LoaderInstance::DispatchTable(pLStack_30);
    pXVar1 = std::
             unique_ptr<XrGeneratedDispatchTableCore,_std::default_delete<XrGeneratedDispatchTableCore>_>
             ::operator->(this);
    local_34 = (*pXVar1->GetActionStateBoolean)
                         ((XrSession)getInfo_local,(XrActionStateGetInfo *)state_local,
                          (XrActionStateBoolean *)loader_instance);
  }
  return local_34;
}

Assistant:

XRAPI_ATTR XrResult XRAPI_CALL xrGetActionStateBoolean(
    XrSession                                   session,
    const XrActionStateGetInfo*                 getInfo,
    XrActionStateBoolean*                       state) XRLOADER_ABI_TRY {
    LoaderInstance* loader_instance;
    XrResult result = ActiveLoaderInstance::Get(&loader_instance, "xrGetActionStateBoolean");
    if (XR_SUCCEEDED(result)) {
        result = loader_instance->DispatchTable()->GetActionStateBoolean(session, getInfo, state);
    }
    return result;
}